

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::pair_range_esc
          (basic_substring<const_char> *this,CC open_close,CC escape)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  size_t sVar7;
  basic_substring<const_char> bVar8;
  basic_substring<const_char> local_38;
  
  sVar7 = 0;
  sVar4 = first_of(this,open_close,0);
  if (sVar4 == 0xffffffffffffffff) {
    pcVar5 = (char *)0x0;
  }
  else {
    uVar1 = this->len;
    pcVar5 = (char *)0x0;
    sVar7 = 0;
    if (sVar4 + 1 < uVar1) {
      lVar6 = 0;
      pcVar5 = this->str;
      do {
        if (((pcVar5 + 1)[sVar4] == open_close) && (pcVar5[sVar4] != escape)) {
          if (uVar1 < sVar4) {
            if ((s_error_flags & 1) != 0) {
              bVar3 = is_debugger_attached();
              if (bVar3) {
                pcVar2 = (code *)swi(3);
                bVar8 = (basic_substring<const_char>)(*pcVar2)();
                return bVar8;
              }
            }
            handle_error(0x1fe047,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1544,"first >= 0 && first <= len");
          }
          if (sVar4 + lVar6 == -3) {
            sVar7 = this->len;
          }
          else {
            sVar7 = lVar6 + sVar4 + 2;
          }
          if (sVar7 < sVar4) {
            if ((s_error_flags & 1) != 0) {
              bVar3 = is_debugger_attached();
              if (bVar3) {
                pcVar2 = (code *)swi(3);
                bVar8 = (basic_substring<const_char>)(*pcVar2)();
                return bVar8;
              }
            }
            handle_error(0x1fe047,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1546,"first <= last");
          }
          if (this->len < sVar7) {
            if ((s_error_flags & 1) != 0) {
              bVar3 = is_debugger_attached();
              if (bVar3) {
                pcVar2 = (code *)swi(3);
                bVar8 = (basic_substring<const_char>)(*pcVar2)();
                return bVar8;
              }
            }
            handle_error(0x1fe047,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1547,"last >= 0 && last <= len");
          }
          basic_substring(&local_38,this->str + sVar4,sVar7 - sVar4);
          pcVar5 = local_38.str;
          sVar7 = local_38.len;
          goto LAB_001f0fb1;
        }
        lVar6 = lVar6 + 1;
        pcVar5 = pcVar5 + 1;
      } while ((sVar4 - uVar1) + 1 + lVar6 != 0);
      pcVar5 = (char *)0x0;
      sVar7 = 0;
    }
  }
LAB_001f0fb1:
  bVar8.len = sVar7;
  bVar8.str = pcVar5;
  return bVar8;
}

Assistant:

basic_substring pair_range_esc(CC open_close, CC escape=CC('\\'))
    {
        size_t b = find(open_close);
        if(b == npos) return basic_substring();
        for(size_t i = b+1; i < len; ++i)
        {
            CC c = str[i];
            if(c == open_close)
            {
                if(str[i-1] != escape)
                {
                    return range(b, i+1);
                }
            }
        }
        return basic_substring();
    }